

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall
Clasp::Constraint::minimize(Constraint *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  undefined4 in_register_00000014;
  LitVec temp;
  
  (*this->_vptr_Constraint[1])(this,s,CONCAT44(in_register_00000014,p.rep_));
  return true;
}

Assistant:

bool Constraint::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	LitVec temp;
	reason(s, p, temp);
	for (LitVec::size_type i = 0; i != temp.size(); ++i) {
		if (!s.ccMinimize(temp[i], rec)) {
			return false;
		}
	}
	return true;
}